

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ItemSize(ImVec2 *size,float text_baseline_y)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ImVec2 IVar4;
  ImGuiWindow *pIVar5;
  float fVar6;
  undefined1 auVar7 [16];
  ImGuiContext *pIVar8;
  ImGuiContext *g;
  undefined1 auVar9 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  pIVar8 = GImGui;
  auVar10._4_60_ = in_register_00001204;
  auVar10._0_4_ = text_baseline_y;
  pIVar5 = GImGui->CurrentWindow;
  if (pIVar5->SkipItems == false) {
    fVar1 = (pIVar5->DC).CurrLineTextBaseOffset;
    auVar11 = ZEXT816(0) << 0x40;
    auVar9 = auVar10._0_16_;
    auVar7 = vcmpps_avx(auVar11,auVar9,6);
    auVar12 = vcmpps_avx(ZEXT416((uint)(fVar1 - text_baseline_y)),auVar11,2);
    auVar7 = vorps_avx(auVar7,auVar12);
    if ((auVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      auVar11 = ZEXT416((uint)(fVar1 - text_baseline_y));
    }
    auVar12 = ZEXT416((uint)(auVar11._0_4_ + size->y));
    auVar11 = ZEXT416((uint)(pIVar5->DC).CurrLineSize.y);
    auVar7 = vcmpss_avx(auVar12,auVar11,2);
    auVar7 = vblendvps_avx(auVar12,auVar11,auVar7);
    fVar6 = (pIVar5->DC).CursorPos.x + size->x;
    (pIVar5->DC).CursorPosPrevLine.x = fVar6;
    fVar2 = (pIVar5->DC).CursorPos.y;
    (pIVar5->DC).CursorPosPrevLine.y = fVar2;
    fVar3 = (pIVar8->Style).ItemSpacing.y;
    auVar12 = vinsertps_avx(ZEXT416((uint)(pIVar5->Pos).x),auVar7,0x10);
    auVar11 = vinsertps_avx(ZEXT416((uint)(pIVar5->DC).Indent.x),ZEXT416((uint)fVar2),0x10);
    auVar14 = vinsertps_avx(ZEXT416((uint)(pIVar5->DC).ColumnsOffset.x),ZEXT416((uint)fVar3),0x10);
    auVar13._0_4_ = (int)(auVar12._0_4_ + auVar11._0_4_ + auVar14._0_4_);
    auVar13._4_4_ = (int)(auVar12._4_4_ + auVar11._4_4_ + auVar14._4_4_);
    auVar13._8_4_ = (int)(auVar12._8_4_ + auVar11._8_4_ + auVar14._8_4_);
    auVar13._12_4_ = (int)(auVar12._12_4_ + auVar11._12_4_ + auVar14._12_4_);
    auVar12 = vcvtdq2ps_avx(auVar13);
    IVar4 = (ImVec2)vmovlps_avx(auVar12);
    (pIVar5->DC).CursorPos = IVar4;
    auVar12 = vmovshdup_avx(auVar12);
    auVar14._8_8_ = 0;
    auVar14._0_4_ = (pIVar5->DC).CursorMaxPos.x;
    auVar14._4_4_ = (pIVar5->DC).CursorMaxPos.y;
    auVar11 = vinsertps_avx(ZEXT416((uint)fVar6),ZEXT416((uint)(auVar12._0_4_ - fVar3)),0x10);
    auVar12 = vcmpps_avx(auVar11,auVar14,2);
    auVar12 = vblendvps_avx(auVar11,auVar14,auVar12);
    IVar4 = (ImVec2)vmovlps_avx(auVar12);
    (pIVar5->DC).CursorMaxPos = IVar4;
    (pIVar5->DC).PrevLineSize.y = auVar7._0_4_;
    (pIVar5->DC).CurrLineSize.y = 0.0;
    auVar7 = vcmpss_avx(auVar9,ZEXT416((uint)fVar1),2);
    auVar7 = vblendvps_avx(auVar9,ZEXT416((uint)fVar1),auVar7);
    (pIVar5->DC).PrevLineTextBaseOffset = auVar7._0_4_;
    (pIVar5->DC).CurrLineTextBaseOffset = 0.0;
    if ((pIVar5->DC).LayoutType == 0) {
      pIVar5->WriteAccessed = true;
      (pIVar5->DC).CursorPos.x = fVar6 + (pIVar8->Style).ItemSpacing.x;
      (pIVar5->DC).CursorPos.y = fVar2;
      (pIVar5->DC).CurrLineSize = (pIVar5->DC).PrevLineSize;
      (pIVar5->DC).CurrLineTextBaseOffset = auVar7._0_4_;
      return;
    }
  }
  return;
}

Assistant:

void ImGui::ItemSize(const ImVec2& size, float text_baseline_y)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    // We increase the height in this function to accommodate for baseline offset.
    // In theory we should be offsetting the starting position (window->DC.CursorPos), that will be the topic of a larger refactor,
    // but since ItemSize() is not yet an API that moves the cursor (to handle e.g. wrapping) enlarging the height has the same effect.
    const float offset_to_match_baseline_y = (text_baseline_y >= 0) ? ImMax(0.0f, window->DC.CurrLineTextBaseOffset - text_baseline_y) : 0.0f;
    const float line_height = ImMax(window->DC.CurrLineSize.y, size.y + offset_to_match_baseline_y);

    // Always align ourselves on pixel boundaries
    //if (g.IO.KeyAlt) window->DrawList->AddRect(window->DC.CursorPos, window->DC.CursorPos + ImVec2(size.x, line_height), IM_COL32(255,0,0,200)); // [DEBUG]
    window->DC.CursorPosPrevLine.x = window->DC.CursorPos.x + size.x;
    window->DC.CursorPosPrevLine.y = window->DC.CursorPos.y;
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);    // Next line
    window->DC.CursorPos.y = IM_FLOOR(window->DC.CursorPos.y + line_height + g.Style.ItemSpacing.y);        // Next line
    window->DC.CursorMaxPos.x = ImMax(window->DC.CursorMaxPos.x, window->DC.CursorPosPrevLine.x);
    window->DC.CursorMaxPos.y = ImMax(window->DC.CursorMaxPos.y, window->DC.CursorPos.y - g.Style.ItemSpacing.y);
    //if (g.IO.KeyAlt) window->DrawList->AddCircle(window->DC.CursorMaxPos, 3.0f, IM_COL32(255,0,0,255), 4); // [DEBUG]

    window->DC.PrevLineSize.y = line_height;
    window->DC.CurrLineSize.y = 0.0f;
    window->DC.PrevLineTextBaseOffset = ImMax(window->DC.CurrLineTextBaseOffset, text_baseline_y);
    window->DC.CurrLineTextBaseOffset = 0.0f;

    // Horizontal layout mode
    if (window->DC.LayoutType == ImGuiLayoutType_Horizontal)
        SameLine();
}